

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

int __thiscall hwnet::util::Timer::cancel(Timer *this)

{
  pthread_t pVar1;
  int iVar2;
  pthread_t pVar3;
  bool bVar4;
  __shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  shared_ptr<hwnet::util::Timer> s;
  
  LOCK();
  bVar4 = (this->mStatus).super___atomic_base<unsigned_int>._M_i == 0;
  if (bVar4) {
    (this->mStatus).super___atomic_base<unsigned_int>._M_i = 2;
  }
  UNLOCK();
  if (!bVar4) {
    LOCK();
    bVar4 = (this->mStatus).super___atomic_base<unsigned_int>._M_i == 4;
    if (bVar4) {
      (this->mStatus).super___atomic_base<unsigned_int>._M_i = 6;
    }
    UNLOCK();
    if (!bVar4) {
      return 3;
    }
  }
  if (((this->mStatus).super___atomic_base<unsigned_int>._M_i & 4) == 0) {
    std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::util::Timer,void>
              (local_28,(__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)this);
    TimerMgr::remove(this->mMgr,(char *)local_28);
    if (s.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 s.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    iVar2 = 0;
  }
  else {
    pVar1 = (this->tid)._M_thread;
    pVar3 = pthread_self();
    iVar2 = (pVar1 != pVar3) + 1;
  }
  return iVar2;
}

Assistant:

int Timer::cancel() {

	uint expected1 = 0;
	uint expected2 = Timer::incallback;
	uint setv1 = Timer::canceled;
	uint setv2 = Timer::incallback | Timer::canceled;
	if(mStatus.compare_exchange_strong(expected1,setv1) || mStatus.compare_exchange_strong(expected2,setv2)) {
		if(mStatus.load() & Timer::incallback) {
			if(this->tid == std::this_thread::get_id()) {
				//在回调函数调用栈内,定时器不会再被执行
				return Timer::doing_callback_in_current_thread;
			} else {
				//定时器正在当前线程不同的线程中执行回调，定时器不会再被执行
				return Timer::doing_callback_in_other_thread;
			}
		} else {
			auto s = shared_from_this();
			mMgr->remove(s);
			return Timer::cancel_ok;
		}
	} else {
		return Timer::invaild_timer;
	} 
}